

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O1

bool __thiscall
axl::sl::Array<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>::
setCountImpl<axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>::Construct>
          (Array<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
           *this,size_t count)

{
  int32_t *piVar1;
  HookCommonContext **__s;
  FreeFunc *pFVar2;
  Hdr *pHVar3;
  size_t sVar4;
  EVP_PKEY_CTX *dst;
  HookCommonContext **ppHVar5;
  Ret *pRVar6;
  HookCommonContext **ppHVar7;
  Hdr *pHVar8;
  long lVar9;
  Ret *pRVar10;
  ulong uVar11;
  Hdr *pHVar12;
  Ret *pRVar13;
  bool bVar14;
  Ptr<axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>::Hdr> hdr;
  Ptr<axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>::Hdr> local_38;
  
  pHVar12 = (this->
            super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
            ).m_hdr;
  if ((pHVar12 == (Hdr *)0x0) || ((pHVar12->super_BufHdr).super_RefCount.m_refCount != 1)) {
LAB_0012c472:
    if (count == 0) {
      ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>::
      release(&this->
               super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
             );
      return true;
    }
    if ((this->
        super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
        ).m_count != 0) {
      sVar4 = getAllocSize<4096ul>(count * 0x10);
      dst = (EVP_PKEY_CTX *)operator_new(sVar4 + 0x30,(nothrow_t *)&std::nothrow);
      *(undefined4 *)(dst + 0x10) = 0;
      *(undefined4 *)(dst + 0x14) = 1;
      *(size_t *)(dst + 0x18) = sVar4;
      *(undefined8 *)(dst + 0x20) = 0;
      *(undefined ***)dst = &PTR__Hdr_0019d070;
      *(code **)(dst + 8) = mem::deallocate;
      local_38.m_p = (Hdr *)0x0;
      local_38.m_refCount = (RefCount *)0x0;
      rc::Ptr<axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>::Hdr>::copy(&local_38,dst,dst);
      bVar14 = local_38.m_p != (Hdr *)0x0;
      if (bVar14) {
        (local_38.m_p)->m_count = count;
        pHVar12 = local_38.m_p + 1;
        uVar11 = (this->
                 super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
                 ).m_count;
        if (uVar11 < count) {
          if (0 < (long)uVar11) {
            pRVar6 = (this->
                     super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
                     ).m_p;
            pHVar8 = pHVar12;
            do {
              pFVar2 = (FreeFunc *)pRVar6->m_originalRet;
              (pHVar8->super_BufHdr).super_RefCount._vptr_RefCount = (_func_int **)pRVar6->m_context
              ;
              (pHVar8->super_BufHdr).super_RefCount.m_freeFunc = pFVar2;
              pHVar8 = (Hdr *)&(pHVar8->super_BufHdr).super_RefCount.m_refCount;
              pRVar6 = pRVar6 + 1;
            } while (pHVar8 < &(pHVar12->super_BufHdr).super_RefCount._vptr_RefCount + uVar11 * 2);
          }
          sVar4 = (this->
                  super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
                  ).m_count;
          if (0 < (long)(count - sVar4)) {
            __s = (HookCommonContext **)
                  (&(pHVar12->super_BufHdr).super_RefCount._vptr_RefCount + sVar4 * 2);
            ppHVar7 = (HookCommonContext **)
                      (&(pHVar12->super_BufHdr).super_RefCount.m_refCount + sVar4 * 4);
            ppHVar5 = __s + (count - sVar4) * 2;
            if (__s + (count - sVar4) * 2 <= ppHVar7) {
              ppHVar5 = ppHVar7;
            }
            memset(__s,0,(~(ulong)__s + (long)ppHVar5 & 0xfffffffffffffff0) + 0x10);
          }
        }
        else if (0 < (long)count) {
          pRVar6 = (this->
                   super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
                   ).m_p;
          pHVar8 = pHVar12;
          do {
            pFVar2 = (FreeFunc *)pRVar6->m_originalRet;
            (pHVar8->super_BufHdr).super_RefCount._vptr_RefCount = (_func_int **)pRVar6->m_context;
            (pHVar8->super_BufHdr).super_RefCount.m_freeFunc = pFVar2;
            pHVar8 = (Hdr *)&(pHVar8->super_BufHdr).super_RefCount.m_refCount;
            pRVar6 = pRVar6 + 1;
          } while (pHVar8 < &(pHVar12->super_BufHdr).super_RefCount._vptr_RefCount + count * 2);
        }
        pHVar8 = (this->
                 super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
                 ).m_hdr;
        LOCK();
        piVar1 = &(pHVar8->super_BufHdr).super_RefCount.m_refCount;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          (**(pHVar8->super_BufHdr).super_RefCount._vptr_RefCount)(pHVar8);
          LOCK();
          piVar1 = &(pHVar8->super_BufHdr).super_RefCount.m_weakRefCount;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if ((*piVar1 == 0) &&
             (pFVar2 = (pHVar8->super_BufHdr).super_RefCount.m_freeFunc, pFVar2 != (FreeFunc *)0x0))
          {
            (*pFVar2)(pHVar8);
          }
        }
        pHVar3 = local_38.m_p;
        (this->
        super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
        ).m_p = (Ret *)pHVar12;
        local_38.m_p = (Hdr *)0x0;
        local_38.m_refCount = (RefCount *)0x0;
        (this->
        super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
        ).m_hdr = pHVar3;
        (this->
        super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
        ).m_count = count;
      }
      rc::Ptr<axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>::Hdr>::clear(&local_38);
      return bVar14;
    }
    bVar14 = reserve(this,count);
    if (!bVar14) {
      return bVar14;
    }
    if ((long)count < 1) goto LAB_0012c67a;
    pRVar6 = (this->
             super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
             ).m_p;
    pRVar13 = pRVar6 + count;
    if (pRVar6 + count <= pRVar6 + 1) {
      pRVar13 = pRVar6 + 1;
    }
    uVar11 = (long)&pRVar13->m_context + ~(ulong)pRVar6;
  }
  else {
    uVar11 = (this->
             super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
             ).m_count;
    bVar14 = true;
    if (count == uVar11) {
      return true;
    }
    if ((pHVar12->super_BufHdr).m_bufferSize < count * 0x10) goto LAB_0012c472;
    lVar9 = count - uVar11;
    if ((count < uVar11 || lVar9 == 0) || (lVar9 < 1)) goto LAB_0012c67a;
    pRVar13 = (this->
              super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>
              ).m_p;
    pRVar6 = pRVar13 + uVar11;
    pRVar13 = pRVar13 + uVar11 + 1;
    pRVar10 = pRVar6 + lVar9;
    if (pRVar6 + lVar9 <= pRVar13) {
      pRVar10 = pRVar13;
    }
    uVar11 = (long)&pRVar10->m_context + ~(ulong)pRVar6;
  }
  memset(pRVar6,0,(uVar11 & 0xfffffffffffffff0) + 0x10);
LAB_0012c67a:
  ((this->
   super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>).
  m_hdr)->m_count = count;
  (this->
  super_ArrayRef<axl::spy::ThreadState::Ret,_axl::sl::ArrayDetails<axl::spy::ThreadState::Ret>_>).
  m_count = count;
  return bVar14;
}

Assistant:

bool
	setCountImpl(size_t count) {
		size_t size = count * sizeof(T);

		if (this->m_hdr &&
			this->m_hdr->getRefCount() == 1) {
			if (this->m_count == count)
				return true;

			if (this->m_hdr->m_bufferSize >= size) {
				if (count > this->m_count)
					Construct() (this->m_p + this->m_count, count - this->m_count);
				else
					Details::destruct(this->m_p + count, this->m_count - count);

				Details::setHdrCount(this->m_hdr, count);
				this->m_count = count;
				return true;
			}
		}

		if (count == 0) {
			this->release();
			return true;
		}

		if (!this->m_count) {
			bool result = reserve(count);
			if (!result)
				return false;

			Construct() (this->m_p, count);
			Details::setHdrCount(this->m_hdr, count);
			this->m_count = count;
			return true;
		}

		ASSERT(this->m_hdr);

		size_t bufferSize = getAllocSize(size);

		rc::Ptr<Hdr> hdr = AXL_RC_NEW_ARGS_EXTRA(Hdr, (bufferSize), bufferSize);
		if (!hdr)
			return false;

		Details::setHdrCount(hdr, count);

		T* p = (T*)(hdr + 1);

		if (count <= this->m_count) {
			Details::constructCopy(p, this->m_p, count);
		} else {
			Details::constructCopy(p, this->m_p, this->m_count);
			Construct() (p + this->m_count, count - this->m_count);
		}

		this->m_hdr->release();

		this->m_p = p;
		this->m_hdr = hdr.detach();
		this->m_count = count;
		return true;
	}